

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

Split * __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::SubdivRecalculatePrimRef,_2UL>::find
          (Split *__return_storage_ptr__,
          HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::SubdivRecalculatePrimRef,_2UL>
          *this,SetMB *set,size_t logBlockSize)

{
  size_t begin;
  size_t end;
  char cVar1;
  runtime_error *this_00;
  task_group_context *context_00;
  BBox1f local_2c0;
  TemporalBinInfo local_2b8;
  TemporalBinInfo local_228;
  anon_class_32_4_7a9d95a5_conflict1 bin;
  undefined1 local_170 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_160;
  undefined1 local_150 [8];
  task_group_context context;
  blocked_range<unsigned_long> local_c8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_2b8.count0[0] = 0;
  local_2b8.count1[0] = 0;
  local_2b8.bounds1[0].bounds0.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds0.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds0.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds1[0].bounds0.upper.field_0._8_8_ = 0xff800000ff800000;
  local_2b8.bounds1[0].bounds1.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds1.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds1[0].bounds1.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds1[0].bounds1.upper.field_0._8_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds0.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds0.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds0.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds0.upper.field_0._8_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds1.lower.field_0._0_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds1.lower.field_0._8_8_ = 0x7f8000007f800000;
  local_2b8.bounds0[0].bounds1.upper.field_0._0_8_ = 0xff800000ff800000;
  local_2b8.bounds0[0].bounds1.upper.field_0._8_8_ = 0xff800000ff800000;
  context_00 = (task_group_context *)set->prims->items;
  begin = (set->super_PrimInfoMB).object_range._begin;
  end = (set->super_PrimInfoMB).object_range._end;
  local_2c0 = (set->super_PrimInfoMB).time_range;
  if (end - begin < 0xc00) {
    TemporalBinInfo::bin
              (&local_2b8,(PrimRefMB *)context_00,begin,end,local_2c0,set,&this->recalculatePrimRef)
    ;
  }
  else {
    bin.time_range = &local_2c0;
    local_c8.my_end = 0;
    local_c8.my_begin = 0;
    local_78 = 0x7f8000007f800000;
    uStack_70 = 0x7f8000007f800000;
    local_68 = 0xff800000ff800000;
    uStack_60 = 0xff800000ff800000;
    local_58 = 0x7f8000007f800000;
    uStack_50 = 0x7f8000007f800000;
    local_48 = 0xff800000ff800000;
    uStack_40 = 0xff800000ff800000;
    local_c8.my_grainsize = 0x7f8000007f800000;
    uStack_b0 = 0x7f8000007f800000;
    local_a8 = 0xff800000ff800000;
    uStack_a0 = 0xff800000ff800000;
    local_98 = 0x7f8000007f800000;
    uStack_90 = 0x7f8000007f800000;
    local_88 = 0xff800000ff800000;
    uStack_80 = 0xff800000ff800000;
    bin.prims = (PrimRefMB **)&stack0xfffffffffffffd38;
    bin.set = set;
    bin.recalculatePrimRef = &this->recalculatePrimRef;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_150 = (undefined1  [8])0x400;
    local_170._0_8_ = TemporalBinInfo::merge2;
    local_170._8_8_ = &bin;
    local_160._0_8_ = end;
    local_160._8_8_ = begin;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::SubdivRecalculatePrimRef,2ul>::TemporalBinInfo,embree::parallel_reduce<unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::SubdivRecalculatePrimRef,2ul>::TemporalBinInfo,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::SubdivRecalculatePrimRef,2ul>::TemporalBinInfo::bin_parallel(embree::PrimRefMB_const*,unsigned_long,unsigned_long,unsigned_long,unsigned_long,embree::BBox<float>,embree::SetMB_const&,embree::sse2::SubdivRecalculatePrimRef_const&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::SubdivRecalculatePrimRef,2ul>::TemporalBinInfo_const(embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::SubdivRecalculatePrimRef,2ul>::TemporalBinInfo_const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::P___emporalSplit<embree::PrimRefMB,embree::sse2::SubdivRecalculatePrimRef,2ul>::TemporalBinInfo_const&)>
              (&local_228,(d1 *)(local_170 + 0x10),&local_c8,(TemporalBinInfo *)local_170,
               (anon_class_16_2_ed117de8_conflict37 *)TemporalBinInfo::merge2,
               (_func_TemporalBinInfo_TemporalBinInfo_ptr_TemporalBinInfo_ptr *)&context,context_00)
    ;
    cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar1 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    local_2b8.count0[0] = local_228.count0[0];
    local_2b8.count1[0] = local_228.count1[0];
    local_2b8.bounds0[0].bounds0.lower.field_0._0_8_ =
         local_228.bounds0[0].bounds0.lower.field_0._0_8_;
    local_2b8.bounds0[0].bounds0.lower.field_0._8_8_ =
         local_228.bounds0[0].bounds0.lower.field_0._8_8_;
    local_2b8.bounds0[0].bounds0.upper.field_0._0_8_ =
         local_228.bounds0[0].bounds0.upper.field_0._0_8_;
    local_2b8.bounds0[0].bounds0.upper.field_0._8_8_ =
         local_228.bounds0[0].bounds0.upper.field_0._8_8_;
    local_2b8.bounds0[0].bounds1.lower.field_0._0_8_ =
         local_228.bounds0[0].bounds1.lower.field_0._0_8_;
    local_2b8.bounds0[0].bounds1.lower.field_0._8_8_ =
         local_228.bounds0[0].bounds1.lower.field_0._8_8_;
    local_2b8.bounds0[0].bounds1.upper.field_0._0_8_ =
         local_228.bounds0[0].bounds1.upper.field_0._0_8_;
    local_2b8.bounds0[0].bounds1.upper.field_0._8_8_ =
         local_228.bounds0[0].bounds1.upper.field_0._8_8_;
    local_2b8.bounds1[0].bounds0.lower.field_0._0_8_ =
         local_228.bounds1[0].bounds0.lower.field_0._0_8_;
    local_2b8.bounds1[0].bounds0.lower.field_0._8_8_ =
         local_228.bounds1[0].bounds0.lower.field_0._8_8_;
    local_2b8.bounds1[0].bounds0.upper.field_0._0_8_ =
         local_228.bounds1[0].bounds0.upper.field_0._0_8_;
    local_2b8.bounds1[0].bounds0.upper.field_0._8_8_ =
         local_228.bounds1[0].bounds0.upper.field_0._8_8_;
    local_2b8.bounds1[0].bounds1.lower.field_0._0_8_ =
         local_228.bounds1[0].bounds1.lower.field_0._0_8_;
    local_2b8.bounds1[0].bounds1.lower.field_0._8_8_ =
         local_228.bounds1[0].bounds1.lower.field_0._8_8_;
    local_2b8.bounds1[0].bounds1.upper.field_0._0_8_ =
         local_228.bounds1[0].bounds1.upper.field_0._0_8_;
    local_2b8.bounds1[0].bounds1.upper.field_0._8_8_ =
         local_228.bounds1[0].bounds1.upper.field_0._8_8_;
  }
  TemporalBinInfo::best
            (__return_storage_ptr__,&local_2b8,(int)logBlockSize,(set->super_PrimInfoMB).time_range,
             set);
  if (__return_storage_ptr__->dim == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize)
        {
          assert(set.size() > 0);
          TemporalBinInfo binner(empty);
          binner.bin_parallel(set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,set.time_range,set,recalculatePrimRef);
          Split tsplit = binner.best((int)logBlockSize,set.time_range,set);
          if (!tsplit.valid()) tsplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return tsplit;
        }